

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateParser
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,
                     "private static volatile com.google.protobuf.Parser<$classname$> PARSER;\n\npublic static com.google.protobuf.Parser<$classname$> parser() {\n  return DEFAULT_INSTANCE.getParserForType();\n}\n"
                     ,"classname",*(string **)(this->super_MessageGenerator).descriptor_);
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateParser(io::Printer* printer) {
  printer->Print(
      "private static volatile com.google.protobuf.Parser<$classname$> PARSER;\n"
      "\n"
      "public static com.google.protobuf.Parser<$classname$> parser() {\n"
      "  return DEFAULT_INSTANCE.getParserForType();\n"
      "}\n",
      "classname", descriptor_->name());
}